

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddBtreeIndex
              (WhereLoopBuilder *pBuilder,SrcList_item *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  WhereLoop *p;
  Parse *pPVar2;
  sqlite3 *db;
  Expr *pEVar3;
  WhereLoopBuilder *pWVar4;
  Parse *pPVar5;
  u8 affinity;
  byte bVar6;
  LogEst LVar7;
  ushort uVar8;
  short sVar9;
  LogEst LVar10;
  int iVar11;
  int iVar12;
  u32 uVar13;
  uint uVar14;
  WhereTerm *pWVar15;
  Mem *pMVar16;
  ulong uVar17;
  ushort uVar18;
  short sVar19;
  short sVar20;
  undefined6 in_register_0000000a;
  ExprList *pEVar21;
  ulong uVar22;
  uchar *puVar23;
  u64 uVar24;
  ushort uVar25;
  u32 uVar26;
  uint uVar27;
  sqlite3_value *v;
  WhereTerm *pWVar28;
  ExprList_item *pEVar29;
  sqlite3_value *v_00;
  WhereTerm *pTerm;
  long lVar30;
  int local_1a4;
  tRowcnt nOut;
  uint uStack_19c;
  int n;
  ushort local_192;
  WhereTerm *local_190;
  WhereLoopBuilder *local_188;
  WhereTerm *local_180;
  uchar *local_178;
  Index *local_170;
  ulong local_168;
  UnpackedRecord *pRec;
  uint local_158;
  u16 local_154;
  u16 local_152;
  Mem *local_150;
  ulong local_148;
  ulong local_140;
  ExprList *local_138;
  Parse *local_130;
  SrcList_item *local_128;
  ulong local_120;
  int local_114;
  uint local_110;
  ushort local_10a;
  ulong local_108;
  int local_fc;
  int local_f8;
  uint local_f4;
  Parse *local_f0;
  sqlite3 *local_e8;
  undefined8 local_e0;
  sqlite3_value *local_d8;
  Mem *local_d0;
  int local_c4;
  int local_c0;
  u32 local_bc;
  CollSeq *local_b8;
  sqlite3 *local_b0;
  Bitmask local_a8;
  WhereScan scan;
  
  local_e0 = CONCAT62(in_register_0000000a,nInMul);
  local_130 = pBuilder->pWInfo->pParse;
  local_e8 = local_130->db;
  if (local_e8->mallocFailed != '\0') {
    return 7;
  }
  p = pBuilder->pNew;
  local_110 = p->wsFlags;
  uVar14 = 0x1bf;
  if ((local_110 & 0x20) != 0) {
    uVar14 = 0x18;
  }
  uVar27 = uVar14 & 0xffffff83;
  if ((*(ushort *)&pProbe->field_0x63 & 4) == 0) {
    uVar27 = uVar14;
  }
  pWVar28 = (WhereTerm *)(ulong)uVar27;
  local_192 = (p->u).btree.nEq;
  local_168 = (ulong)local_192;
  local_152 = (p->u).btree.nBtm;
  local_154 = (p->u).btree.nTop;
  local_10a = p->nSkip;
  uVar25 = p->nLTerm;
  local_a8 = p->prereq;
  local_158 = (uint)(ushort)p->nOut;
  local_188 = pBuilder;
  pWVar15 = whereScanInit(&scan,pBuilder->pWC,pSrc->iCursor,(uint)local_192,uVar27,pProbe);
  p->rSetup = 0;
  local_c4 = (int)*pProbe->aiRowLogEst;
  LVar7 = estLog(*pProbe->aiRowLogEst);
  local_f4 = (uint)uVar25;
  local_fc = local_f4 + 1;
  local_f8 = (int)LVar7;
  local_180 = (WhereTerm *)0x0;
  local_190 = (WhereTerm *)0x0;
  iVar11 = 0;
  local_128 = pSrc;
  do {
    if ((iVar11 != 0) || (pWVar15 == (WhereTerm *)0x0)) goto LAB_0018cbd1;
    uVar25 = pWVar15->eOperator;
    iVar12 = local_188->nRecValid;
    if (((uVar25 == 0x100) || ((pWVar15->wtFlags & 0x80) != 0)) &&
       (iVar11 = indexColumnNotNull(pProbe,(int)local_168), iVar11 != 0)) {
LAB_0018bdce:
      iVar11 = 0;
    }
    else {
      iVar11 = 0;
      local_c0 = iVar12;
      if ((((pWVar15->prereqRight & p->maskSelf) == 0) &&
          ((uVar25 != 0x10 || ((pWVar15->wtFlags & 0x100) == 0)))) &&
         ((((pSrc->fg).jointype & 8) == 0 || (iVar11 = 0, (pWVar15->pExpr->flags & 1) != 0)))) {
        if (pProbe->onError == '\0') {
LAB_0018be30:
          uVar14 = 1;
        }
        else {
          uVar14 = 2;
          if (pProbe->nKeyCol - 1 != (int)local_168) goto LAB_0018be30;
        }
        local_188->bldFlags = local_188->bldFlags | uVar14;
        p->wsFlags = local_110;
        (p->u).btree.nEq = local_192;
        (p->u).btree.nBtm = local_152;
        (p->u).btree.nTop = local_154;
        p->nLTerm = (u16)local_f4;
        iVar12 = whereLoopResize(local_e8,p,local_fc);
        iVar11 = 0;
        if (iVar12 != 0) goto LAB_0018cbd1;
        uVar8 = p->nLTerm;
        uVar18 = uVar8 + 1;
        p->nLTerm = uVar18;
        p->aLTerm[uVar8] = pWVar15;
        p->prereq = ~p->maskSelf & (pWVar15->prereqRight | local_a8);
        if ((uVar25 & 1) == 0) {
          if ((uVar25 & 0x82) == 0) {
            if ((uVar25 >> 8 & 1) == 0) {
              pWVar28 = pWVar15;
              if ((uVar25 & 0x24) == 0) {
                p->wsFlags = p->wsFlags | 0x12;
                iVar11 = whereRangeVectorLen(local_130,pSrc->iCursor,pProbe,(int)local_168,pWVar15);
                (p->u).btree.nTop = (u16)iVar11;
                uVar13 = p->wsFlags;
                if ((uVar13 & 0x20) == 0) {
                  local_180 = (WhereTerm *)0x0;
                }
                else {
                  local_180 = p->aLTerm[(ulong)p->nLTerm - 2];
                }
                uVar17 = 0;
                local_190 = pWVar15;
              }
              else {
                p->wsFlags = p->wsFlags | 0x22;
                iVar12 = whereRangeVectorLen(local_130,pSrc->iCursor,pProbe,(int)local_168,pWVar15);
                (p->u).btree.nBtm = (u16)iVar12;
                if ((pWVar15->wtFlags & 0x100) == 0) {
                  uVar13 = p->wsFlags;
                  uVar17 = 0;
                  local_190 = (WhereTerm *)0x0;
                  local_180 = pWVar15;
                }
                else {
                  iVar12 = whereLoopResize(local_e8,p,p->nLTerm + 1);
                  if (iVar12 != 0) {
LAB_0018cbd1:
                    p->prereq = local_a8;
                    (p->u).btree.nEq = local_192;
                    (p->u).btree.nBtm = local_152;
                    (p->u).btree.nTop = local_154;
                    p->nSkip = local_10a;
                    p->wsFlags = local_110;
                    p->nOut = (LogEst)local_158;
                    p->nLTerm = (u16)local_f4;
                    if (local_192 != local_10a) {
                      return iVar11;
                    }
                    if ((uint)pProbe->nKeyCol <= (int)local_168 + 1U) {
                      return iVar11;
                    }
                    if ((pProbe->field_0x63 & 0x40) != 0) {
                      return iVar11;
                    }
                    if ((local_e8->dbOptFlags & 0x4000) != 0) {
                      return iVar11;
                    }
                    if (pProbe->aiRowLogEst[local_168 + 1] < 0x2a) {
                      return iVar11;
                    }
                    iVar11 = whereLoopResize(local_e8,p,local_fc);
                    if (iVar11 != 0) {
                      return iVar11;
                    }
                    (p->u).btree.nEq = (p->u).btree.nEq + 1;
                    uVar14._0_2_ = p->nLTerm;
                    uVar14._2_2_ = p->nSkip;
                    p->nLTerm = (undefined2)uVar14 + 1;
                    p->nSkip = uVar14._2_2_ + 1;
                    p->aLTerm[uVar14 & 0xffff] = (WhereTerm *)0x0;
                    pbVar1 = (byte *)((long)&p->wsFlags + 1);
                    *pbVar1 = *pbVar1 | 0x80;
                    sVar20 = pProbe->aiRowLogEst[local_168] - pProbe->aiRowLogEst[local_168 + 1];
                    p->nOut = p->nOut - sVar20;
                    whereLoopAddBtreeIndex(local_188,pSrc,pProbe,(short)local_e0 + sVar20 + 5);
                    p->nOut = (LogEst)local_158;
                    (p->u).btree.nEq = local_192;
                    p->nSkip = local_192;
                    p->wsFlags = local_110;
                    return 0;
                  }
                  uVar8 = p->nLTerm;
                  p->nLTerm = uVar8 + 1;
                  p->aLTerm[uVar8] = pWVar15 + 1;
                  uVar13 = p->wsFlags | 0x10;
                  p->wsFlags = uVar13;
                  (p->u).btree.nTop = 1;
                  uVar17 = 0;
                  local_190 = pWVar15 + 1;
                  local_180 = pWVar15;
                }
              }
            }
            else {
              uVar13 = p->wsFlags | 8;
              p->wsFlags = uVar13;
LAB_0018c06f:
              uVar17 = 0;
            }
          }
          else {
            sVar20 = pProbe->aiColumn[local_168];
            uVar14 = p->wsFlags;
            uVar13 = uVar14 | 1;
            p->wsFlags = uVar13;
            if (sVar20 == -1) {
LAB_0018bf48:
              uVar13 = uVar14 | 0x1001;
            }
            else {
              uVar17 = 0;
              if (((short)local_e0 != 0) || (sVar20 < 0)) goto LAB_0018c072;
              if (pProbe->nKeyCol - 1 != (int)local_168) goto LAB_0018c06f;
              if (((pProbe->field_0x63 & 8) != 0) ||
                 (((pProbe->nKeyCol == 1 && (uVar25 == 2)) && (pProbe->onError != '\0'))))
              goto LAB_0018bf48;
              uVar13 = uVar14 | 0x10001;
            }
            p->wsFlags = uVar13;
            uVar17 = 0;
          }
        }
        else {
          pEVar3 = pWVar15->pExpr;
          if ((pEVar3->flags & 0x800) == 0) {
            uVar17 = 0;
            if (((pEVar3->x).pList != (ExprList *)0x0) &&
               (uVar24 = (u64)((pEVar3->x).pList)->nExpr, uVar24 != 0)) {
              LVar7 = sqlite3LogEst(uVar24);
              uVar17 = (ulong)(uint)(int)LVar7;
            }
          }
          else {
            uVar8 = 1;
            if (1 < uVar18) {
              uVar8 = uVar18;
            }
            uVar17 = 0x2e;
            for (uVar22 = 0; uVar8 - 1 != uVar22; uVar22 = uVar22 + 1) {
              if ((p->aLTerm[uVar22] != (WhereTerm *)0x0) && (p->aLTerm[uVar22]->pExpr == pEVar3)) {
                uVar17 = 0;
              }
            }
          }
          if (((pProbe->field_0x63 & 0x80) != 0) &&
             (sVar20 = pProbe->aiRowLogEst[local_168], LVar7 = estLog((LogEst)uVar17),
             pSrc = local_128, (int)LVar7 + (int)sVar20 + 10 < (int)uVar17 + local_f8))
          goto LAB_0018bdce;
          uVar13 = p->wsFlags | 4;
          p->wsFlags = uVar13;
        }
LAB_0018c072:
        pWVar4 = local_188;
        if ((uVar13 & 2) == 0) {
          uVar14 = (p->u).vtab.idxNum + 1;
          (p->u).btree.nEq = (u16)uVar14;
          if ((pWVar15->truthProb < 1) && (-1 < pProbe->aiColumn[local_168])) {
            p->nOut = p->nOut + (pWVar15->truthProb - (short)uVar17);
LAB_0018c1c5:
            sVar20 = (short)uVar17;
          }
          else {
            uVar14 = uVar14 & 0xffff;
            puVar23 = (uchar *)(ulong)uVar14;
            _nOut = (Mem *)((ulong)_nOut & 0xffffffff00000000);
            if (((((short)local_e0 == 0) &&
                 ((pProbe->nSample != 0 && ((int)uVar14 <= pProbe->nSampleCol)))) &&
                (((uVar25 & 1) == 0 || ((pWVar15->pExpr->flags & 0x800) == 0)))) &&
               ((local_e8->dbOptFlags & 0x800) == 0)) {
              local_178 = puVar23;
              if ((uVar25 & 0x182) == 0) {
                pEVar21 = (pWVar15->pExpr->x).pList;
                local_170 = pProbe;
                local_120 = uVar17;
                local_140 = sqlite3LogEstToInt(*((local_188->pNew->u).btree.pIndex)->aiRowLogEst);
                iVar12 = pWVar4->nRecValid;
                pEVar29 = pEVar21->a;
                lVar30 = 0;
                iVar11 = 0;
                uVar14 = 0;
                local_138 = pEVar21;
                while (pWVar4 = local_188, pSrc = local_128, pProbe = local_170, iVar11 == 0) {
                  if (local_138->nExpr <= lVar30) {
                    uVar27 = (uint)local_140;
                    if ((long)(ulong)uVar14 <= (long)local_140) {
                      uVar27 = uVar14;
                    }
                    _nOut = (Mem *)CONCAT44(uStack_19c,uVar27);
                    break;
                  }
                  pRec = (UnpackedRecord *)CONCAT44(pRec._4_4_,(uint)local_140);
                  iVar11 = whereEqualScanEst(local_130,local_188,pEVar29->pExpr,(tRowcnt *)&pRec);
                  uVar14 = uVar14 + (int)pRec;
                  pWVar4->nRecValid = iVar12;
                  lVar30 = lVar30 + 1;
                  pEVar29 = pEVar29 + 1;
                }
              }
              else {
                local_120 = uVar17;
                iVar11 = whereEqualScanEst(local_130,local_188,pWVar15->pExpr->pRight,&nOut);
              }
              if ((iVar11 != 0xc) && (iVar11 != 0)) goto LAB_0018cbd1;
              sVar20 = (short)local_120;
              puVar23 = local_178;
              uVar17 = local_120;
              if (((ulong)_nOut & 0xffffffff) == 0) goto LAB_0018c0a6;
              LVar7 = sqlite3LogEst((ulong)_nOut & 0xffffffff);
              sVar19 = (short)local_158;
              if (LVar7 < (short)local_158) {
                sVar19 = LVar7;
              }
              LVar7 = sVar19 - sVar20;
            }
            else {
LAB_0018c0a6:
              sVar20 = (short)uVar17;
              sVar19 = (pProbe->aiRowLogEst[(long)puVar23] -
                       pProbe->aiRowLogEst[(long)(puVar23 + -1)]) + p->nOut;
              p->nOut = sVar19;
              if ((uVar25 >> 8 & 1) == 0) goto LAB_0018c76c;
              LVar7 = sVar19 + 10;
            }
            p->nOut = LVar7;
          }
        }
        else {
          local_1a4 = (int)p->nOut;
          pPVar2 = (Parse *)(p->u).btree.pIndex;
          uVar14 = (pPVar2->constraintName).n;
          uVar22 = (ulong)uVar14;
          pWVar15 = local_190;
          pTerm = local_180;
          local_120 = uVar17;
          if (0 < (int)uVar14) {
            uVar25 = (p->u).btree.nEq;
            pEVar21 = (ExprList *)(ulong)uVar25;
            local_148 = uVar22;
            local_138 = pEVar21;
            if (((int)(uint)uVar25 < *(int *)&(pPVar2->constraintName).field_0xc) &&
               (db = local_130->db, (db->dbOptFlags & 0x800) == 0)) {
              local_f0 = pPVar2;
              if (local_188->nRecValid == (uint)uVar25) {
                pRec = local_188->pRec;
                local_140 = CONCAT44(local_140._4_4_,(uint)(p->u).btree.nBtm);
                uVar8 = (p->u).btree.nTop;
                if ((Index *)pRec != (Index *)0x0) {
                  *(ushort *)&((Index *)pRec)->aiRowLogEst = uVar25;
                }
                if (uVar25 == 0) {
                  uVar14 = pPVar2->nTableLock;
                  uVar27 = 0;
                  local_170 = pProbe;
                }
                else {
                  local_170 = pProbe;
                  whereKeyStats(pPVar2,(Index *)pRec,(UnpackedRecord *)0x0,(int)&nOut,
                                (tRowcnt *)pWVar28);
                  uVar14 = uStack_19c + nOut;
                  uVar27 = nOut;
                }
                pPVar5 = local_f0;
                local_148 = (ulong)uVar14;
                pWVar28 = (WhereTerm *)(ulong)uVar8;
                pWVar15 = local_180;
                pTerm = local_190;
                if (*(char *)((long)pEVar21->a + *(long *)&pPVar2->nMem + -8) == '\0') {
                  pWVar28 = (WhereTerm *)(local_140 & 0xffffffff);
                  local_140 = CONCAT44(local_140._4_4_,(uint)uVar8);
                  pWVar15 = local_190;
                  pTerm = local_180;
                }
                if (pTerm == (WhereTerm *)0x0) {
                  uVar14 = 0;
                  local_150 = (Mem *)CONCAT44(local_150._4_4_,0xfffffffe);
                  pTerm = (WhereTerm *)0x0;
                }
                else {
                  local_178 = (uchar *)CONCAT44(local_178._4_4_,uVar27);
                  pEVar3 = pTerm->pExpr->pRight;
                  uVar14 = sqlite3Stat4ProbeSetValue
                                     (local_130,(Index *)local_f0,&pRec,pEVar3,(int)pWVar28,
                                      (int)local_138,&n);
                  iVar11 = n;
                  if (n == 0 || uVar14 != 0) {
                    local_150 = (Mem *)CONCAT44(local_150._4_4_,0xfffffffe);
                    uVar27 = (uint)local_178;
                  }
                  else {
                    local_108 = (ulong)uVar14;
                    iVar12 = sqlite3ExprVectorSize(pEVar3);
                    uVar14 = 0xc;
                    if (iVar11 < iVar12) {
                      uVar14 = 0x18;
                    }
                    iVar11 = whereKeyStats(pPVar5,(Index *)pRec,(UnpackedRecord *)0x0,(int)&nOut,
                                           (tRowcnt *)pWVar28);
                    local_150 = (Mem *)CONCAT44(local_150._4_4_,iVar11);
                    uVar14 = pTerm->eOperator & uVar14;
                    if (uVar14 != 0) {
                      uVar14 = uStack_19c;
                    }
                    uVar27 = (uint)local_178;
                    if ((uint)local_178 < uVar14 + nOut) {
                      uVar27 = uVar14 + nOut;
                    }
                    local_1a4 = local_1a4 + -1;
                    pTerm = (WhereTerm *)0x0;
                    uVar14 = (uint)local_108;
                  }
                }
                pPVar2 = local_f0;
                if (pWVar15 == (WhereTerm *)0x0) {
                  iVar11 = -1;
                  pWVar15 = (WhereTerm *)0x0;
                }
                else {
                  local_178 = (uchar *)CONCAT44(local_178._4_4_,uVar27);
                  pEVar3 = pWVar15->pExpr->pRight;
                  pWVar28 = (WhereTerm *)(local_140 & 0xffffffff);
                  uVar14 = sqlite3Stat4ProbeSetValue
                                     (local_130,(Index *)local_f0,&pRec,pEVar3,(int)local_140,
                                      (int)local_138,&n);
                  iVar11 = n;
                  if (n == 0 || uVar14 != 0) {
                    iVar11 = -1;
                  }
                  else {
                    local_108 = (ulong)uVar14;
                    iVar12 = sqlite3ExprVectorSize(pEVar3);
                    uVar14 = 0xc;
                    if (iVar11 < iVar12) {
                      uVar14 = 0x18;
                    }
                    iVar11 = whereKeyStats(pPVar2,(Index *)pRec,(UnpackedRecord *)0x1,(int)&nOut,
                                           (tRowcnt *)pWVar28);
                    uVar14 = pWVar15->eOperator & uVar14;
                    if (uVar14 != 0) {
                      uVar14 = uStack_19c;
                    }
                    uVar17 = (ulong)(uVar14 + nOut);
                    if ((uint)local_148 <= uVar14 + nOut) {
                      uVar17 = local_148 & 0xffffffff;
                    }
                    local_1a4 = local_1a4 + -1;
                    pWVar15 = (WhereTerm *)0x0;
                    uVar14 = (uint)local_108;
                    local_148 = uVar17;
                  }
                  uVar27 = (uint)local_178;
                }
                pSrc = local_128;
                pProbe = local_170;
                local_188->pRec = pRec;
                if (uVar14 == 0) {
                  iVar12 = 10;
                  uVar14 = (uint)local_148 - uVar27;
                  if (uVar27 <= (uint)local_148 && uVar14 != 0) {
                    LVar7 = sqlite3LogEst((ulong)uVar14);
                    sVar20 = LVar7 + -0x14;
                    if ((int)local_150 != iVar11) {
                      sVar20 = LVar7;
                    }
                    iVar12 = (int)sVar20;
                  }
                  if (iVar12 <= local_1a4) {
                    local_1a4 = iVar12;
                  }
                }
              }
              else {
                local_b0 = db;
                affinity = sqlite3IndexColumnAffinity(db,(Index *)pPVar2,(uint)uVar25);
                pPVar5 = local_130;
                pRec = (UnpackedRecord *)0x0;
                _nOut = (Mem *)0x0;
                local_b8 = sqlite3LocateCollSeq
                                     (local_130,
                                      *(char **)(*(long *)&pPVar2->iSelfTab + (long)pEVar21 * 8));
                if (local_180 == (WhereTerm *)0x0) {
                  iVar11 = 0;
                  local_114 = -1;
                }
                else {
                  iVar11 = sqlite3Stat4ValueFromExpr
                                     (pPVar5,local_180->pExpr->pRight,affinity,
                                      (sqlite3_value **)&pRec);
                  local_114 = 0;
                }
                uVar17 = (ulong)((int)local_148 + 1);
                if (local_190 == (WhereTerm *)0x0) {
LAB_0018c42e:
                  pMVar16 = (Mem *)0x0;
                }
                else {
                  pMVar16 = (Mem *)0x0;
                  if (iVar11 == 0) {
                    iVar11 = sqlite3Stat4ValueFromExpr
                                       (local_130,local_190->pExpr->pRight,affinity,
                                        (sqlite3_value **)&nOut);
                    uVar17 = 0;
                    pMVar16 = _nOut;
                    if (_nOut == (Mem *)0x0) {
                      uVar17 = (ulong)(local_f0->constraintName).n;
                      goto LAB_0018c42e;
                    }
                  }
                }
                local_148 = uVar17;
                local_d0 = pMVar16;
                if (pMVar16 == (Mem *)0x0 && pRec == (UnpackedRecord *)0x0) {
                  v = (sqlite3_value *)pRec;
                  v_00 = (sqlite3_value *)0x0;
                }
                else {
                  local_d8 = (sqlite3_value *)pRec;
                  local_138 = (ExprList *)(ulong)((int)local_138 + 1);
                  local_150 = (Mem *)0x0;
                  uVar24 = 0;
                  uVar17 = local_120;
                  local_170 = pProbe;
                  while ((iVar11 == 0 && ((long)uVar24 < (long)(int)(local_f0->constraintName).n)))
                  {
                    local_178 = *(uchar **)(*(long *)&local_f0->regRowid + uVar24 * 0x28);
                    iVar11 = *(int *)(*(long *)&local_f0->regRowid + 8 + uVar24 * 0x28);
                    n = 0;
                    local_140 = uVar24;
                    if ((char)*local_178 < '\0') {
                      bVar6 = sqlite3GetVarint32(local_178,&local_bc);
                      uVar14 = (uint)bVar6;
                      uVar13 = local_bc;
                    }
                    else {
                      uVar14 = 1;
                      uVar13 = (int)(char)*local_178;
                    }
                    iVar12 = 0x129c1;
                    if ((int)uVar14 < (int)uVar13 && (int)uVar13 <= iVar11) {
                      local_108 = CONCAT44(local_108._4_4_,iVar11);
                      uVar17 = 0;
                      uVar22 = (ulong)local_138 & 0xffffffff;
                      uVar27 = 0;
                      puVar23 = local_178;
                      uVar26 = uVar13;
                      while (iVar11 = (int)uVar22, uVar22 = (ulong)(iVar11 - 1), iVar11 != 0) {
                        if ((char)puVar23[uVar14] < '\0') {
                          bVar6 = sqlite3GetVarint32(puVar23 + uVar14,(u32 *)&n);
                          uVar27 = (uint)bVar6;
                          puVar23 = local_178;
                        }
                        else {
                          uVar27 = 1;
                          n = (int)(char)puVar23[uVar14];
                        }
                        uVar14 = uVar14 + uVar27;
                        if ((int)uVar13 < (int)uVar14) {
                          iVar12 = 0x129c7;
                          goto LAB_0018c664;
                        }
                        uVar17 = (ulong)(uint)n;
                        if (uVar17 < 0x80) {
                          uVar27 = (uint)""[uVar17];
                        }
                        else {
                          uVar27 = n - 0xcU >> 1;
                        }
                        uVar26 = uVar26 + uVar27;
                      }
                      iVar12 = 0x129cd;
                      if ((int)local_108 < (int)uVar26) goto LAB_0018c664;
                      pMVar16 = local_150;
                      if ((local_150 == (Mem *)0x0) &&
                         (pMVar16 = sqlite3ValueNew(local_b0), puVar23 = local_178,
                         pMVar16 == (sqlite3_value *)0x0)) {
                        local_150 = (Mem *)0x0;
                        iVar11 = 7;
                        pSrc = local_128;
                        pProbe = local_170;
                        uVar17 = local_120;
                      }
                      else {
                        sqlite3VdbeSerialGet(puVar23 + (int)(uVar26 - uVar27),(u32)uVar17,pMVar16);
                        pSrc = local_128;
                        pMVar16->enc = local_b0->enc;
                        local_150 = pMVar16;
                        if (local_d8 != (Mem *)0x0) {
                          uVar14 = sqlite3MemCompare(local_d8,pMVar16,local_b8);
                          local_114 = local_114 - ((int)~uVar14 >> 0x1f);
                        }
                        uVar17 = local_120;
                        pProbe = local_170;
                        iVar11 = 0;
                        if (local_d0 != (Mem *)0x0) {
                          uVar14 = sqlite3MemCompare(local_d0,local_150,local_b8);
                          local_148 = (ulong)(uint)((int)local_148 - ((int)~uVar14 >> 0x1f));
                        }
                      }
                    }
                    else {
LAB_0018c664:
                      iVar11 = sqlite3CorruptError(iVar12);
                      pSrc = local_128;
                      pProbe = local_170;
                      uVar17 = local_120;
                    }
                    uVar24 = local_140 + 1;
                  }
                  uVar14 = (int)local_148 - local_114;
                  if (((local_180 == (WhereTerm *)0x0) || (local_190 == (WhereTerm *)0x0)) ||
                     (v = local_d8, v_00 = local_150, 1 < (int)uVar14)) {
                    uVar24 = (u64)uVar14;
                    if ((int)uVar14 < 2) {
                      uVar24 = 1;
                    }
                    LVar7 = sqlite3LogEst((long)(int)(local_f0->constraintName).n);
                    LVar10 = sqlite3LogEst(uVar24);
                    p->nOut = p->nOut + (LVar10 - LVar7);
                    sqlite3ValueFree(local_d8);
                    sqlite3ValueFree(local_d0);
                    sqlite3ValueFree(local_150);
                    goto LAB_0018c1c5;
                  }
                }
                sqlite3ValueFree(v);
                sqlite3ValueFree(local_d0);
                sqlite3ValueFree(v_00);
                pWVar15 = local_190;
                pTerm = local_180;
              }
            }
          }
          LVar7 = whereRangeAdjust(pTerm,(LogEst)local_1a4);
          uVar8 = whereRangeAdjust(pWVar15,LVar7);
          uVar25 = uVar8;
          if (((pTerm != (WhereTerm *)0x0) && (pWVar15 != (WhereTerm *)0x0)) &&
             ((0 < pTerm->truthProb && (uVar25 = uVar8 - 0x14, pWVar15->truthProb < 1)))) {
            uVar25 = uVar8;
          }
          iVar11 = local_1a4 + (uint)(pWVar15 == (WhereTerm *)0x0) + -2 +
                   (uint)(pTerm == (WhereTerm *)0x0);
          uVar8 = 10;
          if (10 < (short)uVar25) {
            uVar8 = uVar25;
          }
          uVar25 = (ushort)iVar11;
          if ((int)(uint)uVar8 <= iVar11) {
            uVar25 = uVar8;
          }
          p->nOut = uVar25;
          sVar20 = (short)local_120;
        }
LAB_0018c76c:
        pWVar4 = local_188;
        sVar19 = p->nOut;
        sVar9 = sqlite3LogEstAdd((LogEst)local_f8,
                                 (short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow) +
                                 sVar19 + 1);
        if ((p->wsFlags & 0x140) == 0) {
          sVar9 = sqlite3LogEstAdd(sVar9,sVar19 + 0x10);
        }
        sVar20 = sVar20 + (short)local_e0;
        p->rRun = sVar9 + sVar20;
        p->nOut = sVar19 + sVar20;
        whereLoopOutputAdjust(pWVar4->pWC,p,(LogEst)local_c4);
        iVar11 = whereLoopInsert(pWVar4,p);
        sVar9 = (short)local_158;
        if ((p->wsFlags & 2) == 0) {
          sVar9 = sVar19;
        }
        p->nOut = sVar9;
        if (((p->wsFlags & 0x10) == 0) && ((p->u).btree.nEq < pProbe->nColumn)) {
          whereLoopAddBtreeIndex(pWVar4,local_128,pProbe,sVar20);
        }
        p->nOut = (LogEst)local_158;
        pWVar4->nRecValid = local_c0;
        pSrc = local_128;
      }
    }
    pWVar15 = whereScanNext(&scan);
  } while( true );
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  struct SrcList_item *pSrc,      /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d\n",
                     pProbe->pTable->zName,pProbe->zName, pNew->u.btree.nEq));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* Do not allow constraints from the WHERE clause to be used by the
    ** right table of a LEFT JOIN.  Only constraints in the ON clause are
    ** allowed */
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
    ){
      continue;
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags |= SQLITE_BLDF_UNIQUE;
    }else{
      pBuilder->bldFlags |= SQLITE_BLDF_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0 
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0 
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0 
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
        assert( nIn>0 );  /* RHS always has 2 or more terms...  The parser
                          ** changes "x IN (?)" into "x=?". */
      }
      if( pProbe->hasStat1 ){
        LogEst M, logK, safetyMargin;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the 
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        safetyMargin = 10;  /* TUNING: extra weight for indexed IN */
        if( M + logK + safetyMargin < nIn + rLogSize ){
          WHERETRACE(0x40,
            ("Scan preferred over IN operator on column %d of \"%s\" (%d<%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
          continue;
        }else{
          WHERETRACE(0x40,
            ("IN operator preferred on column %d of \"%s\" (%d>=%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID 
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull 
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ) 
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range contraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all 
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat3/stat4 data. Or, if there is no stat3/stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0 
         && pProbe->nSample 
         && pNew->u.btree.nEq<=pProbe->nSampleCol
         && ((eOp & WO_IN)==0 || !ExprHasProperty(pTerm->pExpr, EP_xIsSelect))
         && OptimizationEnabled(db, SQLITE_Stat34)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a 
            ** "col IS NULL" expression matches twice as many rows 
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18. 
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower. 
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && pProbe->noSkipScan==0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}